

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int fp_list(int argc,long argv)

{
  int iVar1;
  char *pcVar2;
  int in_stack_000006a0;
  int in_stack_000006a4;
  undefined8 local_450;
  LONGLONG sizell;
  int local_440;
  int stat;
  int iarg;
  int hdunum;
  char msg [513];
  char local_228 [8];
  char infits [513];
  fitsfile *infptr;
  char **argv_local;
  int argc_local;
  
  sizell._4_4_ = 0;
  local_440 = in_stack_000006a0;
  if (in_stack_000006a4 != 0x2a) {
    fp_msg("Error: internal initialization error\n");
    exit(-1);
  }
  while( true ) {
    if (argc <= local_440) {
      return 0;
    }
    strncpy(local_228,*(char **)(argv + (long)local_440 * 8),0x200);
    infits[0x1f8] = '\0';
    pcVar2 = strchr(local_228,0x5b);
    if ((pcVar2 != (char *)0x0) || (pcVar2 = strchr(local_228,0x5d), pcVar2 != (char *)0x0)) {
      fp_msg("Error: section/extension notation not supported: ");
      fp_msg(local_228);
      fp_msg("\n");
      exit(-1);
    }
    iVar1 = fp_access(local_228);
    if (iVar1 != 0) {
      fp_msg("Error: can\'t find or read input file ");
      fp_msg(local_228);
      fp_msg("\n");
      fp_noop();
      exit(-1);
    }
    ffopentest(10,infits + 0x200,local_228,0,(long)&sizell + 4);
    if (sizell._4_4_ != 0) break;
    ffthdu(stack0xffffffffffffffe0,&stat,(long)&sizell + 4);
    ffmahd(stack0xffffffffffffffe0,stat,0,(long)&sizell + 4);
    ffghadll(stack0xffffffffffffffe0,0,0,&local_450,(long)&sizell + 4);
    if (sizell._4_4_ != 0) {
      fp_abort_output(stack0xffffffffffffffe0,(fitsfile *)0x0,sizell._4_4_);
    }
    snprintf((char *)&iarg,0x201,"# %s (",local_228);
    fp_msg((char *)&iarg);
    snprintf((char *)&iarg,0x201,"%lld bytes)\n",local_450);
    fp_msg((char *)&iarg);
    fp_info_hdu(stack0xffffffffffffffe0);
    ffclos(stack0xffffffffffffffe0,(long)&sizell + 4);
    if (sizell._4_4_ != 0) {
      ffrprt(_stderr,sizell._4_4_);
      exit(sizell._4_4_);
    }
    local_440 = local_440 + 1;
  }
  ffrprt(_stderr,sizell._4_4_);
  exit(sizell._4_4_);
}

Assistant:

int fp_list (int argc, char *argv[], fpstate fpvar)
{
	fitsfile *infptr;
	char	infits[SZ_STR], msg[SZ_STR];
	int	hdunum, iarg, stat=0;
	LONGLONG sizell;

	if (fpvar.initialized != FP_INIT_MAGIC) {
	    fp_msg ("Error: internal initialization error\n"); exit (-1);
	}

	for (iarg=fpvar.firstfile; iarg < argc; iarg++) {
	    strncpy (infits, argv[iarg], SZ_STR-1);
            infits[SZ_STR-1]=0;

	    if (strchr (infits, '[') || strchr (infits, ']')) {
		fp_msg ("Error: section/extension notation not supported: ");
		fp_msg (infits); fp_msg ("\n"); exit (-1);
	    }

	    if (fp_access (infits) != 0) {
		        fp_msg ("Error: can't find or read input file "); fp_msg (infits);
		        fp_msg ("\n"); fp_noop (); exit (-1);
	    }

	    fits_open_file (&infptr, infits, READONLY, &stat);
	    if (stat) { fits_report_error (stderr, stat); exit (stat); }

	    /* move to the end of file, to get the total size in bytes */
	    fits_get_num_hdus (infptr, &hdunum, &stat);
	    fits_movabs_hdu (infptr, hdunum, NULL, &stat);
	    fits_get_hduaddrll(infptr, NULL, NULL, &sizell, &stat);


	    if (stat) { 
	        fp_abort_output(infptr, NULL, stat);
	    }

            snprintf (msg, SZ_STR,"# %s (", infits); fp_msg (msg);

#if defined(_MSC_VER)
    /* Microsoft Visual C++ 6.0 uses '%I64d' syntax  for 8-byte integers */
        snprintf(msg, SZ_STR,"%I64d bytes)\n", sizell); fp_msg (msg);
#elif (USE_LL_SUFFIX == 1)
        snprintf(msg, SZ_STR,"%lld bytes)\n", sizell); fp_msg (msg);
#else
        snprintf(msg, SZ_STR,"%ld bytes)\n", sizell); fp_msg (msg);
#endif
	    fp_info_hdu (infptr);

	    fits_close_file (infptr, &stat);
	    if (stat) { fits_report_error (stderr, stat); exit (stat); }
	}
	return(0);
}